

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_HRR_Algorithm_Base *this_00;
  int __val;
  HRRDoubletStepList ketsteps;
  string bra_str;
  string ncart_bra_str;
  allocator local_129;
  char *local_128;
  size_type local_120;
  char local_118 [8];
  undefined8 uStack_110;
  char *local_108;
  size_type local_100;
  char local_f8 [8];
  undefined8 uStack_f0;
  _Type local_e8;
  undefined8 uStack_e0;
  HRRDoubletStepList local_d0;
  string local_b8;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  char local_80 [16];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_type local_60;
  char local_58 [16];
  string local_48;
  
  local_e8 = *(_Type *)(am->qam)._M_elems;
  uStack_e0 = 0;
  std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_b8);
  local_68._M_p = local_58;
  local_70._0_4_ = local_e8[0];
  local_70._4_4_ = local_e8[1];
  if (local_108 == local_f8) {
    local_58[8] = (undefined1)uStack_f0;
    local_58[9] = uStack_f0._1_1_;
    local_58[10] = uStack_f0._2_1_;
    local_58[0xb] = uStack_f0._3_1_;
    local_58[0xc] = uStack_f0._4_1_;
    local_58[0xd] = uStack_f0._5_1_;
    local_58[0xe] = uStack_f0._6_1_;
    local_58[0xf] = uStack_f0._7_1_;
  }
  else {
    local_68._M_p = local_108;
  }
  local_60 = local_100;
  local_100 = 0;
  local_f8[0] = '\0';
  local_108 = local_f8;
  __val = NCART((DAM *)local_70);
  std::__cxx11::to_string(&local_48,__val);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_108);
  StringBuilder<char,char_const(&)[2],char_const&>
            (&local_b8,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[0],
             (char (*) [2])0x13acc0,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[1])
  ;
  this_00 = this->hrr_algo_;
  local_e8 = *(_Type *)((am->qam)._M_elems + 2);
  uStack_e0 = 0;
  std::__cxx11::string::string((string *)&local_128,"",&local_129);
  local_90._M_p = local_80;
  local_98._0_4_ = local_e8[0];
  local_98._4_4_ = local_e8[1];
  if (local_128 == local_118) {
    local_80[8] = (undefined1)uStack_110;
    local_80[9] = uStack_110._1_1_;
    local_80[10] = uStack_110._2_1_;
    local_80[0xb] = uStack_110._3_1_;
    local_80[0xc] = uStack_110._4_1_;
    local_80[0xd] = uStack_110._5_1_;
    local_80[0xe] = uStack_110._6_1_;
    local_80[0xf] = uStack_110._7_1_;
  }
  else {
    local_90._M_p = local_128;
  }
  local_88 = local_120;
  local_120 = 0;
  local_118[0] = '\0';
  local_128 = local_118;
  OSTEI_HRR_Algorithm_Base::GetKetSteps(&local_d0,this_00,(DAM *)local_98);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_128);
  WriteKetSteps_(this,os,&local_d0,&am->tag,&local_48,&local_b8);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_d0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(std::ostream & os, QAM am) const
{
    // ncart_bra in string form
    std::string ncart_bra_str = StringBuilder(NCART(DAM{am[0], am[1]}));

    // the bra part in string form
    std::string bra_str = StringBuilder(amchar[am[0]], "_", amchar[am[1]]);

    auto ketsteps = hrr_algo_.GetKetSteps(DAM{am[2], am[3]});
    WriteKetSteps_(os, ketsteps, am.tag, ncart_bra_str, bra_str);
}